

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quadrature.hpp
# Opt level: O2

void __thiscall
IntegratorXX::Quadrature<IntegratorXX::GaussLegendre<double,double>>::
Quadrature<unsigned_long&,void>
          (Quadrature<IntegratorXX::GaussLegendre<double,double>> *this,unsigned_long *args)

{
  unsigned_long *in_RDX;
  _Tuple_impl<0UL,_std::vector<double,_std::allocator<double>_>,_std::vector<double,_std::allocator<double>_>_>
  local_40;
  
  generate<unsigned_long&>
            ((tuple<std::vector<double,_std::allocator<double>_>,_std::vector<double,_std::allocator<double>_>_>
              *)&local_40,(Quadrature<IntegratorXX::GaussLegendre<double,double>> *)args,in_RDX);
  Quadrature<IntegratorXX::GaussLegendre<double,_double>_>::Quadrature
            ((Quadrature<IntegratorXX::GaussLegendre<double,_double>_> *)this,
             (quadrature_return_type *)&local_40);
  std::
  _Tuple_impl<0UL,_std::vector<double,_std::allocator<double>_>,_std::vector<double,_std::allocator<double>_>_>
  ::~_Tuple_impl(&local_40);
  return;
}

Assistant:

Quadrature( Args&&... args ) :
    Quadrature( generate( std::forward<Args>(args)... ) ) { }